

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOSimulationDataGenerator.cpp
# Opt level: O0

U32 __thiscall
MDIOSimulationDataGenerator::GenerateSimulationData
          (MDIOSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channels)

{
  U8 phyAddress;
  U32 UVar1;
  ulong uVar2;
  SimulationChannelDescriptor *pSVar3;
  U8 local_73;
  U16 local_72;
  U16 local_70;
  U8 local_6d;
  U16 UStack_6c;
  U8 phyAddressValue;
  U16 dataValueC45;
  U16 dataValueC22;
  U8 regAddrValue5b;
  U16 regAddrValue;
  U8 devTypeIndex;
  MdioDevType devTypeValues [7];
  byte local_3d;
  MdioOpCode MStack_3c;
  U8 opIndex;
  MdioOpCode opcodeValues [3];
  U64 adjusted_largest_sample_requested;
  SimulationChannelDescriptor **simulation_channels_local;
  U32 sample_rate_local;
  U64 largest_sample_requested_local;
  MDIOSimulationDataGenerator *this_local;
  
  opcodeValues._4_8_ =
       AnalyzerHelpers::AdjustSimulationTargetSample
                 (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  _MStack_3c = 0x200000001;
  opcodeValues[0] = C45_READ;
  local_3d = 0;
  _dataValueC22 = 0x100000000;
  devTypeValues[0] = DEV_WIS;
  devTypeValues[1] = DEV_PCS;
  devTypeValues[2] = DEV_PHY_XS;
  devTypeValues[3] = DEV_DTE_XS;
  devTypeValues[4] = DEV_OTHER;
  dataValueC45._1_1_ = 0;
  UStack_6c = 0;
  local_6d = '\0';
  local_70 = 0;
  local_72 = 0;
  local_73 = '\0';
  while( true ) {
    uVar2 = SimulationChannelDescriptor::GetCurrentSampleNumber();
    if ((ulong)opcodeValues._4_8_ <= uVar2) break;
    phyAddress = local_73 + '\x01';
    CreateMdioC45Transaction
              (this,(&MStack_3c)[(int)((uint)local_3d % 3)],local_73,
               *(MdioDevType *)(&dataValueC22 + (long)(int)((uint)dataValueC45._1_1_ % 7) * 2),
               UStack_6c,local_72);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x18);
    local_73 = local_73 + '\x02';
    CreateMdioC22Transaction
              (this,(&MStack_3c)[(int)((uint)local_3d % 3)],phyAddress,local_6d,local_70);
    ClockGenerator::AdvanceByHalfPeriod(20.0);
    SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x18);
    local_72 = local_72 + 1;
    local_70 = local_70 + 1;
    local_6d = local_6d + '\x01';
    UStack_6c = UStack_6c + 1;
    dataValueC45._1_1_ = dataValueC45._1_1_ + 1;
    local_3d = local_3d + 1;
  }
  pSVar3 = (SimulationChannelDescriptor *)SimulationChannelDescriptorGroup::GetArray();
  *simulation_channels = pSVar3;
  UVar1 = SimulationChannelDescriptorGroup::GetCount();
  return UVar1;
}

Assistant:

U32 MDIOSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                         SimulationChannelDescriptor** simulation_channels )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    MdioOpCode opcodeValues[ 3 ] = { C45_WRITE, C22_READ, C45_READ }; // address
    U8 opIndex = 0;

    MdioDevType devTypeValues[ 7 ] = { DEV_RESERVED, DEV_PMD_PMA, DEV_WIS, DEV_PCS, DEV_PHY_XS, DEV_DTE_XS, DEV_OTHER };
    U8 devTypeIndex = 0;

    U16 regAddrValue = 0;
    U8 regAddrValue5b = 0;

    U16 dataValueC22 = 0;
    U16 dataValueC45 = 0;
    U8 phyAddressValue = 0;

    while( mMdc->GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        CreateMdioC45Transaction( opcodeValues[ opIndex % 3 ],         // OpCode
                                  phyAddressValue++,                   // PHY Address
                                  devTypeValues[ devTypeIndex++ % 7 ], // DevType
                                  regAddrValue++,                      // Register Address
                                  dataValueC45++                       // Data
        );

        mSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 5 periods of idle

        CreateMdioC22Transaction( opcodeValues[ opIndex++ % 3 ], // OpCode
                                  phyAddressValue++,             // PHY Address
                                  regAddrValue5b++,              // Register Address
                                  dataValueC22++                 // Data
        );

        mSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 20.0 ) ); // insert 10 periods of idle
    }

    *simulation_channels = mSimulationChannels.GetArray();
    return mSimulationChannels.GetCount();
}